

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O3

ggml_cgraph * gpt2_graph(gpt2_model *model,gpt2_batch *batch,bool measure)

{
  ggml_tensor *pgVar1;
  ggml_cgraph *pgVar2;
  uint32_t uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  undefined7 in_register_00000011;
  long lVar9;
  long lVar10;
  uint32_t uVar11;
  ulong uVar12;
  gpt2_model *pgVar13;
  long lVar14;
  ulong uVar15;
  float fVar16;
  allocator_type local_109;
  gpt2_model *local_108;
  long local_100;
  undefined8 local_f8;
  float local_ec;
  long local_e8;
  ulong local_e0;
  undefined8 local_d8;
  ulong local_d0;
  long local_c8;
  float local_bc;
  ggml_cgraph *local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  ulong local_80;
  long local_78;
  long local_70;
  long local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  size_t local_48;
  pointer puStack_40;
  undefined1 local_38;
  
  uVar11 = (model->hparams).n_ctx;
  lVar9 = (long)(int)uVar11;
  lVar14 = (long)batch->n_tokens;
  if ((int)CONCAT71(in_register_00000011,measure) == 0) {
    uVar11 = (model->kv_cache).n;
    uVar3 = (model->kv_cache).head;
  }
  else {
    uVar3 = uVar11 - batch->n_tokens;
  }
  local_e8 = CONCAT44(local_e8._4_4_,uVar3);
  local_d0 = (ulong)(uint)(model->hparams).n_layer;
  local_e0 = (ulong)(model->hparams).n_embd;
  local_c8 = (long)(model->hparams).n_head;
  local_108 = model;
  local_100 = lVar14;
  if ((gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf_size == '\0') &&
     (iVar4 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf_size),
     iVar4 != 0)) {
    lVar14 = ggml_tensor_overhead();
    lVar10 = ggml_graph_overhead_custom(0x1000,0);
    gpt2_graph::buf_size = lVar10 + lVar14 * 0x1000;
    __cxa_guard_release(&gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf_size);
    lVar14 = local_100;
  }
  if ((gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf == '\0') &&
     (iVar4 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf),
     iVar4 != 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&gpt2_graph::buf,gpt2_graph::buf_size,&local_109);
    __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                 &gpt2_graph::buf,&__dso_handle);
    __cxa_guard_release(&gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf);
    lVar14 = local_100;
  }
  local_48 = gpt2_graph::buf_size;
  puStack_40 = gpt2_graph::buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_38 = 1;
  uVar5 = ggml_init();
  local_b8 = (ggml_cgraph *)ggml_new_graph_custom(uVar5,0x1000,0);
  if (batch->token == (id *)0x0) {
    if (batch->embd == (float *)0x0) {
      uVar5 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/gpt-2/main-batched.cpp"
                         ,0x248,"GGML_ASSERT(%s) failed","batch.embd");
      __cxa_guard_abort(&gpt2_graph(gpt2_model_const&,gpt2_batch_const&,bool)::buf);
      _Unwind_Resume(uVar5);
    }
    uVar6 = ggml_new_tensor_2d(uVar5,0,local_e0,lVar14);
    ggml_set_name(uVar6,"embd");
    local_f8 = uVar6;
    ggml_set_input(uVar6);
  }
  else {
    uVar6 = ggml_new_tensor_1d(uVar5,0x1a,lVar14);
    ggml_set_name(uVar6,"inp_tokens");
    ggml_set_input(uVar6);
    uVar7 = ggml_new_tensor_1d(uVar5,0x1a,lVar14);
    ggml_set_name(uVar7,"position");
    ggml_set_input(uVar7);
    pgVar13 = local_108;
    uVar6 = ggml_get_rows(uVar5,local_108->wte,uVar6);
    lVar14 = local_100;
    uVar7 = ggml_get_rows(uVar5,pgVar13->wpe,uVar7);
    local_f8 = ggml_add(uVar5,uVar6,uVar7);
  }
  local_90 = (long)(int)uVar11;
  uVar6 = ggml_new_tensor_3d(uVar5,0,local_90,lVar14,1);
  ggml_set_name(uVar6,"KQ_mask");
  local_60 = uVar6;
  ggml_set_input(uVar6);
  uVar6 = local_f8;
  pgVar13 = local_108;
  if (0 < (int)local_d0) {
    local_68 = local_e0 * 4;
    local_70 = local_e0 * 8;
    iVar4 = (int)local_e0;
    local_88 = (long)((int)lVar14 * iVar4);
    local_98 = (long)(int)(uVar11 * iVar4);
    local_ec = (float)iVar4 / (float)(int)local_c8;
    local_a8 = (long)(int)local_e8 * local_e0;
    local_78 = lVar9 * local_e0;
    local_80 = local_d0 * 0x60;
    uVar15 = 0;
    local_bc = SQRT(local_ec);
    lVar10 = 0;
    local_b0 = 0;
    uVar12 = local_e0;
    local_a0 = lVar9;
    do {
      local_f8 = uVar6;
      uVar6 = ggml_norm((pgVar13->hparams).eps,uVar5);
      uVar6 = ggml_mul(uVar5,uVar6,
                       *(undefined8 *)
                        ((long)&((pgVar13->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_1_g + uVar15));
      uVar6 = ggml_add(uVar5,uVar6,
                       *(undefined8 *)
                        ((long)&((pgVar13->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_1_b + uVar15));
      uVar6 = ggml_mul_mat(uVar5,*(undefined8 *)
                                  ((long)&((pgVar13->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_attn_attn_w
                                  + uVar15),uVar6);
      local_d0 = uVar15;
      lVar9 = ggml_add(uVar5,uVar6,
                       *(undefined8 *)
                        ((long)&((pgVar13->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->c_attn_attn_b + uVar15));
      local_d8 = ggml_view_2d(uVar5,lVar9,uVar12,lVar14,*(undefined8 *)(lVar9 + 0x38),0);
      local_50 = ggml_view_2d(uVar5,lVar9,uVar12,lVar14,*(undefined8 *)(lVar9 + 0x38),local_68);
      uVar6 = ggml_view_2d(uVar5,lVar9,uVar12,lVar14,*(undefined8 *)(lVar9 + 0x38),local_70);
      local_e8 = lVar10;
      if (0 < (int)lVar14) {
        pgVar1 = (pgVar13->kv_cache).k;
        local_58 = uVar6;
        lVar8 = ggml_element_size(pgVar1);
        lVar9 = local_88;
        lVar14 = local_a8;
        lVar10 = local_b0 * local_a0;
        uVar6 = ggml_view_1d(uVar5,pgVar1,local_88,lVar8 * local_a8);
        pgVar1 = (local_108->kv_cache).v;
        lVar8 = ggml_element_size(pgVar1);
        pgVar13 = local_108;
        uVar7 = ggml_view_1d(uVar5,pgVar1,lVar9,lVar8 * lVar14);
        uVar6 = ggml_cpy(uVar5,local_50,uVar6);
        pgVar2 = local_b8;
        ggml_build_forward_expand(local_b8,uVar6);
        uVar6 = ggml_cpy(uVar5,local_58,uVar7);
        ggml_build_forward_expand(pgVar2,uVar6);
        lVar14 = local_100;
      }
      lVar9 = local_c8;
      uVar12 = local_e0;
      lVar8 = (long)(int)((long)((ulong)(uint)((int)local_e0 >> 0x1f) << 0x20 |
                                local_e0 & 0xffffffff) / (long)(int)local_c8);
      uVar6 = ggml_cont_3d(uVar5,local_d8,lVar8,local_c8,lVar14);
      local_d8 = ggml_permute(uVar5,uVar6,0,2,1,3);
      pgVar1 = (pgVar13->kv_cache).k;
      lVar14 = ggml_element_size(pgVar1);
      uVar6 = ggml_view_1d(uVar5,pgVar1,local_98,lVar14 * lVar10 * uVar12);
      uVar6 = ggml_reshape_3d(uVar5,uVar6,lVar8,lVar9,local_90);
      uVar6 = ggml_permute(uVar5,uVar6,0,2,1,3);
      uVar6 = ggml_mul_mat(uVar5,uVar6,local_d8);
      fVar16 = local_bc;
      if (local_ec < 0.0) {
        fVar16 = sqrtf(local_ec);
      }
      uVar6 = ggml_scale(1.0 / fVar16,uVar5,uVar6);
      uVar6 = ggml_add(uVar5,uVar6,local_60);
      uVar6 = ggml_soft_max(uVar5,uVar6);
      pgVar13 = local_108;
      pgVar1 = (local_108->kv_cache).v;
      lVar14 = ggml_element_size(pgVar1);
      uVar7 = ggml_view_1d(uVar5,pgVar1,local_98,lVar10 * uVar12 * lVar14);
      lVar9 = local_90;
      lVar14 = local_c8;
      uVar7 = ggml_reshape_3d(uVar5,uVar7,lVar8,local_c8,local_90);
      uVar7 = ggml_permute(uVar5,uVar7,1,2,0,3);
      uVar7 = ggml_cont_3d(uVar5,uVar7,lVar9,lVar8,lVar14);
      uVar6 = ggml_mul_mat(uVar5,uVar7,uVar6);
      uVar6 = ggml_permute(uVar5,uVar6,0,2,1);
      uVar12 = local_e0;
      lVar14 = local_100;
      uVar6 = ggml_cont_2d(uVar5,uVar6,local_e0,local_100);
      uVar15 = local_d0;
      uVar6 = ggml_mul_mat(uVar5,*(undefined8 *)
                                  ((long)&((pgVar13->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_attn_proj_w
                                  + local_d0),uVar6);
      uVar6 = ggml_add(uVar5,uVar6,
                       *(undefined8 *)
                        ((long)&((pgVar13->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->c_attn_proj_b + uVar15));
      uVar6 = ggml_add(uVar5,uVar6,local_f8);
      uVar7 = ggml_norm((pgVar13->hparams).eps,uVar5,uVar6);
      uVar7 = ggml_mul(uVar5,uVar7,
                       *(undefined8 *)
                        ((long)&((pgVar13->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_2_g + uVar15));
      uVar7 = ggml_add(uVar5,uVar7,
                       *(undefined8 *)
                        ((long)&((pgVar13->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->ln_2_b + uVar15));
      uVar7 = ggml_mul_mat(uVar5,*(undefined8 *)
                                  ((long)&((pgVar13->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_w +
                                  uVar15),uVar7);
      uVar7 = ggml_add(uVar5,uVar7,
                       *(undefined8 *)
                        ((long)&((pgVar13->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->c_mlp_fc_b + uVar15));
      uVar7 = ggml_gelu(uVar5,uVar7);
      uVar7 = ggml_mul_mat(uVar5,*(undefined8 *)
                                  ((long)&((pgVar13->layers).
                                           super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_w
                                  + uVar15),uVar7);
      uVar7 = ggml_add(uVar5,uVar7,
                       *(undefined8 *)
                        ((long)&((pgVar13->layers).
                                 super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl
                                 .super__Vector_impl_data._M_start)->c_mlp_proj_b + uVar15));
      uVar6 = ggml_add(uVar5,uVar7,uVar6);
      local_b0 = local_b0 + 1;
      lVar10 = local_e8 + local_a0;
      local_a8 = local_a8 + local_78;
      uVar15 = uVar15 + 0x60;
    } while (local_80 != uVar15);
  }
  uVar6 = ggml_norm((pgVar13->hparams).eps,uVar5,uVar6);
  uVar6 = ggml_mul(uVar5,uVar6,pgVar13->ln_f_g);
  uVar6 = ggml_add(uVar5,uVar6,pgVar13->ln_f_b);
  uVar6 = ggml_mul_mat(uVar5,pgVar13->lm_head,uVar6);
  pgVar2 = local_b8;
  ggml_build_forward_expand(local_b8,uVar6);
  ggml_free(uVar5);
  return pgVar2;
}

Assistant:

struct ggml_cgraph * gpt2_graph(
        const  gpt2_model  & model,
        const  gpt2_batch  & batch,
                     bool    measure) {
    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;

    const auto & kv_cache = model.kv_cache;

    const int32_t n_tokens = batch.n_tokens;
    const int32_t n_kv     = measure ? n_ctx            : kv_cache.n;
    const int32_t kv_head  = measure ? n_ctx - n_tokens : kv_cache.head;

    // since we are using ggml-alloc, this buffer only needs enough space to hold the ggml_tensor and ggml_cgraph structs, but not the tensor data
    static size_t buf_size = ggml_tensor_overhead()*GPT2_MAX_NODES + ggml_graph_overhead_custom(GPT2_MAX_NODES, false);
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph  * gf = ggml_new_graph_custom(ctx, GPT2_MAX_NODES, false);

    struct ggml_tensor * inpL;
    if (batch.token) {
        struct ggml_tensor * inp_tokens = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, n_tokens);
        ggml_set_name(inp_tokens, "inp_tokens");
        ggml_set_input(inp_tokens);

        struct ggml_tensor * position = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, n_tokens);
        ggml_set_name(position, "position");
        ggml_set_input(position);

        // wte + wpe
        inpL =
            ggml_add(ctx,
                    ggml_get_rows(ctx, model.wte, inp_tokens),
                    ggml_get_rows(ctx, model.wpe, position));
    } else {
        GGML_ASSERT(batch.embd);

        inpL = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_tokens);
        ggml_set_name(inpL, "embd");
        ggml_set_input(inpL);
    }

    // KQ_mask (mask for 1 head, it will be broadcasted to all heads)
    struct ggml_tensor * KQ_mask = ggml_new_tensor_3d(ctx, GGML_TYPE_F32, n_kv, n_tokens, 1);
    ggml_set_name(KQ_mask, "KQ_mask");
    ggml_set_input(KQ_mask);


    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx, inpL, hparams.eps);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx,
                    ggml_mul(ctx,
                        cur,
                        model.layers[il].ln_1_g),
                    model.layers[il].ln_1_b);
        }

        // attn
        // [2304,        768] - model.layers[il].c_attn_attn_w
        // [2304,          1] - model.layers[il].c_attn_attn_b
        // [ 768,   n_tokens] - cur (in)
        // [2304,   n_tokens] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, n_tokens]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_attn_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_attn_b);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx, cur, n_embd, n_tokens, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx, cur, n_embd, n_tokens, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx, cur, n_embd, n_tokens, cur->nb[1], 2*sizeof(float)*n_embd);

            // store key and value to memory
            if (n_tokens >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx, model.kv_cache.k, n_tokens*n_embd, (ggml_element_size(model.kv_cache.k)*n_embd)*(il*n_ctx + kv_head));
                struct ggml_tensor * v = ggml_view_1d(ctx, model.kv_cache.v, n_tokens*n_embd, (ggml_element_size(model.kv_cache.v)*n_embd)*(il*n_ctx + kv_head));

                ggml_build_forward_expand(gf, ggml_cpy(ctx, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx,
                        ggml_cont_3d(ctx,
                            Qcur,
                            n_embd/n_head, n_head, n_tokens),
                        0, 2, 1, 3);

            // K = Kmem.view(n_embd/n_head, n_head, n_kv).permute(0, 2, 1, 3)
            // [64, n_kv, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx,
                        ggml_reshape_3d(ctx,
                            ggml_view_1d(ctx, model.kv_cache.k, n_kv*n_embd, il*n_ctx*ggml_element_size(model.kv_cache.k)*n_embd),
                            n_embd/n_head, n_head, n_kv),
                        0, 2, 1, 3);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.kv_cache.v, n_kv*n_embd, il*n_ctx*ggml_element_size(model.kv_cache.v)*n_embd),
            //                    n_embd/n_head, n_head, n_kv),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_kv, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_kv, n_tokens, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx, K, Q);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_kv, n_tokens, 12]
            struct ggml_tensor * KQ_scaled =
                ggml_scale(ctx,
                        KQ,
                        1.0f/sqrtf(float(n_embd)/n_head));

            // KQ_masked = mask_past(KQ_scaled)
            // [n_kv, n_tokens, 12]
            struct ggml_tensor * KQ_masked = ggml_add(ctx, KQ_scaled, KQ_mask);

            // KQ = soft_max(KQ_masked)
            // [n_kv, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max(ctx, KQ_masked);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_kv).permute(1, 2, 0, 3).contiguous()
            // [n_kv, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cont_3d(ctx,
                        ggml_permute(ctx,
                            ggml_reshape_3d(ctx,
                                ggml_view_1d(ctx, model.kv_cache.v, n_kv*n_embd, il*n_ctx*ggml_element_size(model.kv_cache.v)*n_embd),
                                n_embd/n_head, n_head, n_kv),
                            1, 2, 0, 3),
                        n_kv, n_embd/n_head, n_head);

            // KQV = transpose(V) * KQ_soft_max
            // [64, n_tokens, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx, V_trans, KQ_soft_max);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, n_tokens]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx, KQV, 0, 2, 1, 3);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, n_tokens]
            cur = ggml_cont_2d(ctx, KQV_merged, n_embd, n_tokens);
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_proj_b);
        }

        // add the input
        cur = ggml_add(ctx, cur, inpL);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx, inpFF, hparams.eps);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx,
                        ggml_mul(ctx,
                            cur,
                            model.layers[il].ln_2_g),
                        model.layers[il].ln_2_b);
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_fc_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_fc_b);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx, cur);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_proj_w,
                    cur);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_proj_b);
        }

        // input for next layer
        inpL = ggml_add(ctx, cur, inpFF);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx, inpL, hparams.eps);

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx,
                ggml_mul(ctx,
                    inpL,
                    model.ln_f_g),
                model.ln_f_b);
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx, model.lm_head, inpL);

    // logits -> probs
    //inpL = ggml_soft_max(ctx0, inpL);

    ggml_build_forward_expand(gf, inpL);

    ggml_free(ctx);

    return gf;
}